

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O3

ChCoordsys<double> * __thiscall
chrono::ChLinkDistance::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkDistance *this)

{
  ChBodyFrame *pCVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  ChVector<double> Vx;
  ChVector<double> Vz;
  ChVector<double> Vy;
  ChVector<double> local_a8;
  undefined1 local_88 [16];
  double local_78;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  pCVar1 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformLocalToParent
            (&this->pos1,&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  pCVar1 = (this->super_ChLink).Body2;
  ChTransform<double>::TransformLocalToParent
            (&this->pos2,&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  local_a8.m_data[1] = (double)local_88._8_8_ - local_a8.m_data[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (double)local_88._0_8_ - local_a8.m_data[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_a8.m_data[1] * local_a8.m_data[1];
  auVar4 = vfmadd231sd_fma(auVar27,auVar15,auVar15);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_78 - local_a8.m_data[2];
  auVar4 = vfmadd231sd_fma(auVar4,auVar24,auVar24);
  auVar4 = vsqrtsd_avx(auVar4,auVar4);
  bVar5 = 2.2250738585072014e-308 <= auVar4._0_8_;
  pCVar1 = (this->super_ChLink).Body2;
  dVar26 = 1.0 / auVar4._0_8_;
  auVar11._0_8_ =
       (ulong)bVar5 * (long)(((double)local_88._0_8_ - local_a8.m_data[0]) * dVar26) +
       (ulong)!bVar5 * 0x3ff0000000000000;
  auVar11._8_8_ = 0;
  dVar13 = (double)((ulong)bVar5 * (long)(local_a8.m_data[1] * dVar26));
  uVar2 = (ulong)bVar5 * (long)((local_78 - local_a8.m_data[2]) * dVar26);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar2;
  auVar16._0_8_ =
       dVar13 * *(double *)
                 ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar16._8_8_ =
       dVar13 * *(double *)
                 ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar28._8_8_ = auVar11._0_8_;
  auVar28._0_8_ = auVar11._0_8_;
  auVar3 = vfmadd132pd_fma(auVar28,auVar16,
                           *(undefined1 (*) [16])
                            (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       dVar13 * *(double *)
                 ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar4 = vfmadd231sd_fma(auVar25,auVar11,auVar4);
  auVar17._8_8_ = uVar2;
  auVar17._0_8_ = uVar2;
  local_88 = vfmadd132pd_fma(auVar17,auVar3,
                             *(undefined1 (*) [16])
                              ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.
                                      Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data + 0x30));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar4 = vfmadd231sd_fma(auVar4,auVar12,auVar3);
  local_a8.m_data[2] = 0.0;
  local_78 = auVar4._0_8_;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  XdirToDxDyDz<double>
            ((ChVector<double> *)local_88,(ChVector<double> *)&VECT_Y,&local_a8,&local_48,&local_68)
  ;
  dVar10 = local_48.m_data[2];
  dVar9 = local_48.m_data[0];
  dVar8 = local_68.m_data[1];
  dVar7 = local_68.m_data[0];
  dVar6 = local_a8.m_data[2];
  dVar26 = local_a8.m_data[1];
  dVar13 = local_a8.m_data[0] + local_48.m_data[1] + local_68.m_data[2];
  if (0.0 <= dVar13) {
    dVar13 = dVar13 + 1.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar13;
      auVar4 = vsqrtsd_avx(auVar19,auVar19);
      dVar13 = auVar4._0_8_;
    }
    dVar29 = dVar13 * 0.5;
    dVar13 = 0.5 / dVar13;
    dVar22 = (dVar10 - dVar8) * dVar13;
    dVar23 = (dVar7 - dVar6) * dVar13;
    dVar13 = (dVar26 - dVar9) * dVar13;
    goto LAB_0057cdc9;
  }
  if (local_48.m_data[1] <= local_a8.m_data[0]) {
    if (local_a8.m_data[0] < local_68.m_data[2]) goto LAB_0057cba5;
    dVar13 = ((local_a8.m_data[0] - local_48.m_data[1]) - local_68.m_data[2]) + 1.0;
    if (dVar13 < 0.0) {
      dVar14 = sqrt(dVar13);
    }
    else {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar13;
      auVar4 = vsqrtsd_avx(auVar21,auVar21);
      dVar14 = auVar4._0_8_;
    }
    dVar29 = dVar10 - dVar8;
    dVar22 = dVar14 * 0.5;
    dVar14 = 0.5 / dVar14;
    dVar23 = (dVar9 + dVar26) * dVar14;
    dVar13 = (dVar6 + dVar7) * dVar14;
  }
  else if (local_48.m_data[1] < local_68.m_data[2]) {
LAB_0057cba5:
    dVar13 = ((local_68.m_data[2] - local_a8.m_data[0]) - local_48.m_data[1]) + 1.0;
    if (dVar13 < 0.0) {
      dVar14 = sqrt(dVar13);
    }
    else {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar13;
      auVar4 = vsqrtsd_avx(auVar20,auVar20);
      dVar14 = auVar4._0_8_;
    }
    dVar29 = dVar26 - dVar9;
    dVar13 = dVar14 * 0.5;
    dVar14 = 0.5 / dVar14;
    dVar22 = (dVar6 + dVar7) * dVar14;
    dVar23 = (dVar8 + dVar10) * dVar14;
  }
  else {
    dVar13 = ((local_48.m_data[1] - local_68.m_data[2]) - local_a8.m_data[0]) + 1.0;
    if (dVar13 < 0.0) {
      dVar14 = sqrt(dVar13);
    }
    else {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar13;
      auVar4 = vsqrtsd_avx(auVar18,auVar18);
      dVar14 = auVar4._0_8_;
    }
    dVar29 = dVar7 - dVar6;
    dVar23 = dVar14 * 0.5;
    dVar14 = 0.5 / dVar14;
    dVar13 = (dVar8 + dVar10) * dVar14;
    dVar22 = (dVar9 + dVar26) * dVar14;
  }
  dVar29 = dVar29 * dVar14;
LAB_0057cdc9:
  dVar26 = (this->pos2).m_data[1];
  (__return_storage_ptr__->pos).m_data[0] = (this->pos2).m_data[0];
  (__return_storage_ptr__->pos).m_data[1] = dVar26;
  (__return_storage_ptr__->pos).m_data[2] = (this->pos2).m_data[2];
  (__return_storage_ptr__->rot).m_data[0] = dVar29;
  (__return_storage_ptr__->rot).m_data[1] = dVar22;
  (__return_storage_ptr__->rot).m_data[2] = dVar23;
  (__return_storage_ptr__->rot).m_data[3] = dVar13;
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkDistance::GetLinkRelativeCoords() {
    ChVector<> D2local;
    ChVector<> D2temp = (Vnorm(Body1->TransformPointLocalToParent(pos1) - Body2->TransformPointLocalToParent(pos2)));
    ChVector<> D2rel = Body2->TransformDirectionParentToLocal(D2temp);
    ChVector<> Vx, Vy, Vz;
    XdirToDxDyDz(D2rel, VECT_Y, Vx, Vy, Vz);
    ChMatrix33<> rel_matrix(Vx, Vy, Vz);

    Quaternion Ql2 = rel_matrix.Get_A_quaternion();
    return ChCoordsys<>(pos2, Ql2);
}